

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall UrsaClient::recv_res(UrsaClient *this,socket_t *socket)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  reference this_00;
  reference rhs;
  long in_RDI;
  string req;
  int i;
  int done_per_10;
  uint64_t id;
  uint64_t done;
  uint64_t estimated;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *task;
  iteration_proxy_internal *item_1;
  iteration_proxy_internal __end4_1;
  iteration_proxy_internal __begin4_1;
  iteration_proxy<iterator> *__range4_1;
  iteration_proxy_internal *ndx;
  iteration_proxy_internal __end4;
  iteration_proxy_internal __begin4;
  iteration_proxy<iterator> *__range4;
  iteration_proxy_internal *item;
  iteration_proxy_internal __end3;
  iteration_proxy_internal __begin3;
  iteration_proxy<iterator> *__range3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *file;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  res;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  string result;
  iteration_proxy_internal *in_stack_fffffffffffffa88;
  iteration_proxy_internal *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  input_adapter *in_stack_fffffffffffffaa0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffaa8;
  const_reference in_stack_fffffffffffffab0;
  string *psVar6;
  iteration_proxy_internal *in_stack_fffffffffffffab8;
  char *local_540;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffaf0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffaf8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffb08;
  reference in_stack_fffffffffffffb48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffba8;
  undefined1 allow_exceptions;
  parser_callback_t *in_stack_fffffffffffffbb0;
  input_adapter *in_stack_fffffffffffffbb8;
  bool local_3f1;
  string local_3d0 [24];
  string *in_stack_fffffffffffffc48;
  UrsaClient *in_stack_fffffffffffffc50;
  string local_390 [32];
  string local_370 [32];
  string local_350 [36];
  int local_32c;
  int local_328;
  int local_324;
  unsigned_long local_320;
  unsigned_long local_318;
  unsigned_long local_310;
  reference local_308;
  iteration_proxy_internal *local_300;
  undefined1 in_stack_fffffffffffffd52;
  char in_stack_fffffffffffffd53;
  int in_stack_fffffffffffffd54;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd58;
  string local_298 [32];
  iteration_proxy_internal *local_278;
  iteration_proxy_internal local_248;
  reference local_220;
  reference *local_218;
  int local_20c;
  string local_208 [32];
  iteration_proxy_internal *local_1e8;
  iteration_proxy_internal local_1b8;
  reference local_190;
  reference *local_188;
  string local_180 [32];
  reference local_160;
  reference local_118;
  undefined4 local_cc;
  string local_c8 [152];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  while( true ) {
    uVar3 = std::__cxx11::string::empty();
    allow_exceptions = (undefined1)((ulong)in_stack_fffffffffffffba8 >> 0x38);
    if ((uVar3 & 1) == 0) break;
    s_try_recv<std::__cxx11::string>((socket_t *)in_stack_fffffffffffffa88);
    bVar1 = std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x11fdae);
    if (bVar1) {
      pbVar4 = std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x11fdc1);
      std::__cxx11::string::operator=(local_30,(string *)pbVar4);
    }
    else {
      check_task_status(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x11fe39);
  }
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,(bool)allow_exceptions);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               *)0x11fe9f);
  nlohmann::detail::input_adapter::~input_adapter((input_adapter *)0x11feac);
  if ((*(byte *)(in_RDI + 0x21) & 1) == 0) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
    bVar1 = nlohmann::operator==<const_char_*,_0>
                      (in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
    local_3f1 = false;
    if (bVar1) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[9]>(in_stack_fffffffffffffaa8,(char (*) [9])in_stack_fffffffffffffaa0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)in_stack_fffffffffffffa98);
      local_3f1 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator==(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    }
    if (local_3f1 == false) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
      bVar1 = nlohmann::operator==<const_char_*,_0>
                        (in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
      if (bVar1) {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
        local_190 = (reference)
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::items((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)in_stack_fffffffffffffa88);
        local_188 = &local_190;
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::begin((iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 *)in_stack_fffffffffffffab8);
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::end((iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               *)in_stack_fffffffffffffab8);
        while (bVar1 = nlohmann::detail::
                       iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       ::iteration_proxy_internal::operator!=
                                 (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88), bVar1) {
          local_1e8 = nlohmann::detail::
                      iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      ::iteration_proxy_internal::operator*(&local_1b8);
          poVar5 = std::operator<<((ostream *)&std::cout,"dataset ");
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::iteration_proxy_internal::key(in_stack_fffffffffffffab8);
          poVar5 = std::operator<<(poVar5,local_208);
          std::operator<<(poVar5," ");
          std::__cxx11::string::~string(local_208);
          poVar5 = std::operator<<((ostream *)&std::cout,"[");
          local_20c = (int)std::setw(10);
          poVar5 = std::operator<<(poVar5,(_Setw)local_20c);
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::iteration_proxy_internal::value((iteration_proxy_internal *)0x1203ae);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
          iVar2 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                      *)in_stack_fffffffffffffa90);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          std::operator<<(poVar5,"]");
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::iteration_proxy_internal::value((iteration_proxy_internal *)0x12042d);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
          local_220 = (reference)
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::items((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)in_stack_fffffffffffffa88);
          local_218 = &local_220;
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::begin((iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   *)in_stack_fffffffffffffab8);
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::end((iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 *)in_stack_fffffffffffffab8);
          while (bVar1 = nlohmann::detail::
                         iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         ::iteration_proxy_internal::operator!=
                                   (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88), bVar1) {
            local_278 = nlohmann::detail::
                        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                        ::iteration_proxy_internal::operator*(&local_248);
            in_stack_fffffffffffffb50 =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)std::operator<<((ostream *)&std::cout," (");
            in_stack_fffffffffffffb48 =
                 nlohmann::detail::
                 iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ::iteration_proxy_internal::value((iteration_proxy_internal *)0x120513);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)in_stack_fffffffffffffab8);
            poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffb50,local_298);
            std::operator<<(poVar5,")");
            std::__cxx11::string::~string(local_298);
            nlohmann::detail::
            iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            ::iteration_proxy_internal::operator++(in_stack_fffffffffffffa90);
          }
          std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::iteration_proxy_internal::operator++(in_stack_fffffffffffffa90);
        }
      }
      else {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
        bVar1 = nlohmann::operator==<const_char_*,_0>
                          (in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
        if (bVar1) {
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::items((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffffa88);
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::begin((iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   *)in_stack_fffffffffffffab8);
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::end((iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 *)in_stack_fffffffffffffab8);
          while (bVar1 = nlohmann::detail::
                         iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         ::iteration_proxy_internal::operator!=
                                   (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88), bVar1) {
            local_300 = nlohmann::detail::
                        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                        ::iteration_proxy_internal::operator*
                                  ((iteration_proxy_internal *)&stack0xfffffffffffffd30);
            this_00 = nlohmann::detail::
                      iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      ::iteration_proxy_internal::value((iteration_proxy_internal *)0x12073c);
            local_308 = this_00;
            in_stack_fffffffffffffb08 =
                 (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *)nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffb08);
            local_310 = nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        ::operator_unsigned_long<unsigned_long,_0>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                    *)0x120781);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffb08);
            local_318 = nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        ::operator_unsigned_long<unsigned_long,_0>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                    *)0x1207ba);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffb08);
            local_320 = nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        ::operator_unsigned_long<unsigned_long,_0>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                    *)0x1207f3);
            local_324 = 0;
            if (local_310 != 0) {
              local_324 = (int)((local_318 * 10) / local_310);
            }
            poVar5 = std::operator<<((ostream *)&std::cout,"task ");
            local_328 = (int)std::setw(9);
            poVar5 = std::operator<<(poVar5,(_Setw)local_328);
            std::ostream::operator<<(poVar5,local_320);
            std::operator<<((ostream *)&std::cout," [");
            for (local_32c = 0; local_32c < 10; local_32c = local_32c + 1) {
              if (local_32c < local_324) {
                local_540 = "#";
              }
              else {
                local_540 = " ";
              }
              std::operator<<((ostream *)&std::cout,local_540);
            }
            std::operator<<((ostream *)&std::cout,"] ");
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffb08);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)in_stack_fffffffffffffa88);
            uVar3 = std::__cxx11::string::size();
            if (uVar3 < 0x6f) {
              std::operator<<((ostream *)&std::cout,local_350);
            }
            else {
              std::__cxx11::string::substr((ulong)local_370,(ulong)local_350);
              std::operator<<((ostream *)&std::cout,local_370);
              std::__cxx11::string::~string(local_370);
              std::operator<<((ostream *)&std::cout," (...) ");
              psVar6 = local_350;
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_390,(ulong)psVar6);
              std::operator<<((ostream *)&std::cout,local_390);
              std::__cxx11::string::~string(local_390);
            }
            std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_350);
            nlohmann::detail::
            iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            ::iteration_proxy_internal::operator++(in_stack_fffffffffffffa90);
          }
        }
        else {
          rhs = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          (in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
          bVar1 = nlohmann::operator==<const_char_*,_0>(in_stack_fffffffffffffab0,(char *)rhs);
          if (bVar1) {
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)in_stack_fffffffffffffab8);
            spdlog::error<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x120b6e
                      );
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffc50);
          }
          else {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd53,
                   (bool)in_stack_fffffffffffffd52);
            in_stack_fffffffffffffa90 =
                 (iteration_proxy_internal *)std::operator<<((ostream *)&std::cout,local_3d0);
            std::ostream::operator<<
                      ((ostream *)in_stack_fffffffffffffa90,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_3d0);
          }
        }
      }
    }
    else {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
      local_118 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            (in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)in_stack_fffffffffffffa98);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)in_stack_fffffffffffffa98);
      while (bVar1 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator!=(&in_stack_fffffffffffffa90->anchor,
                                  &in_stack_fffffffffffffa88->anchor), bVar1) {
        local_160 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator*(in_stack_fffffffffffffb08);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffab8);
        poVar5 = std::operator<<((ostream *)&std::cout,local_180);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_180);
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++(&in_stack_fffffffffffffa90->anchor);
      }
    }
    local_cc = 0;
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd53,
           (bool)in_stack_fffffffffffffd52);
    poVar5 = std::operator<<((ostream *)&std::cout,local_c8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_c8);
    local_cc = 1;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_fffffffffffffa90);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void UrsaClient::recv_res(zmq::socket_t *socket) {
    std::string result;
    while (result.empty()) {
        auto r{s_try_recv<std::string>(socket)};
        if (r.has_value()) {
            result = *r;
        } else {
            check_task_status(connection_id);
        }
    }

    auto res = json::parse(result);
    if (this->raw_json) {
        std::cout << res.dump(4) << std::endl;
        return;
    }

    if (res["type"] == "select" && res.find("iterator") == res.end()) {
        for (const auto &file : res["result"]["files"]) {
            std::cout << file.get<std::string>() << std::endl;
        }
    } else if (res["type"] == "topology") {
        for (const auto &item : res["result"]["datasets"].items()) {
            std::cout << "dataset " << item.key() << " ";
            std::cout << "[" << std::setw(10)
                      << item.value()["file_count"].get<int>() << "]";
            for (const auto &ndx : item.value()["indexes"].items()) {
                std::cout << " (" << ndx.value()["type"].get<std::string>()
                          << ")";
            }
            std::cout << std::endl;
        }
    } else if (res["type"] == "status") {
        for (const auto &item : res["result"]["tasks"].items()) {
            const auto &task = item.value();
            uint64_t estimated = task["work_estimated"];
            uint64_t done = task["work_done"];
            uint64_t id = task["id"];
            int done_per_10 = 0;
            if (estimated != 0) {
                done_per_10 = done * 10 / estimated;
            }
            std::cout << "task " << std::setw(9) << id;
            std::cout << " [";
            for (int i = 0; i < 10; i++) {
                std::cout << ((i < done_per_10) ? "#" : " ");
            }
            std::cout << "] ";
            std::string req = task["request"];
            if (req.size() <= 110) {
                std::cout << req;
            } else {
                std::cout << req.substr(0, 53);
                std::cout << " (...) ";
                std::cout << req.substr(req.size() - 50, 50);
            }
            std::cout << std::endl;
        }
    } else if (res["type"] == "error") {
        spdlog::error(res["error"]["message"].get<std::string>());
    } else {
        std::cout << res.dump(4) << std::endl;
    }
}